

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O3

boolean can_make_bones(d_level *lev)

{
  xchar xVar1;
  xchar xVar2;
  boolean bVar3;
  schar sVar4;
  uint uVar5;
  branch *pbVar6;
  trap *ptVar7;
  
  xVar1 = ledger_no(lev);
  if ('\0' < xVar1) {
    xVar1 = ledger_no(lev);
    xVar2 = maxledgerno();
    if (((xVar1 <= xVar2) && (bVar3 = no_bones_level(lev), bVar3 == '\0')) &&
       ((u._1052_1_ & 1) == 0)) {
      pbVar6 = Is_branchlev(lev);
      if (pbVar6 == (branch *)0x0) {
        ptVar7 = (trap *)&level->lev_traps;
        while (ptVar7 = ptVar7->ntrap, ptVar7 != (trap *)0x0) {
          if ((ptVar7->field_0x8 & 0x1f) == 0x12) {
            return '\0';
          }
        }
      }
      sVar4 = depth(lev);
      if ('\0' < sVar4) {
        sVar4 = depth(lev);
        uVar5 = mt_random();
        if ((SUB168(ZEXT416(uVar5) % SEXT816((long)(char)((sVar4 >> 2) + '\x01')),0) == 0) &&
           (flags.debug == '\0')) {
          return '\0';
        }
        return flags.explore == '\0';
      }
    }
  }
  return '\0';
}

Assistant:

boolean can_make_bones(d_level *lev)
{
	struct trap *ttmp;

	if (ledger_no(lev) <= 0 || ledger_no(lev) > maxledgerno())
	    return FALSE;
	if (no_bones_level(lev))
	    return FALSE;		/* no bones for specific levels */
	if (u.uswallow) {
	    return FALSE;		/* no bones when swallowed */
	}
	if (!Is_branchlev(lev)) {
	    /* no bones on non-branches with portals */
	    for (ttmp = level->lev_traps; ttmp; ttmp = ttmp->ntrap)
		if (ttmp->ttyp == MAGIC_PORTAL) return FALSE;
	}

	if (depth(lev) <= 0 ||		/* bulletproofing for endgame */
	   (!rn2(1 + (depth(lev)>>2))	/* fewer ghosts on low levels */
		&& !wizard))
		return FALSE;
	/* don't let multiple restarts generate multiple copies of objects
	 * in bones files */
	if (discover) return FALSE;
	return TRUE;
}